

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

TargetList * Analyser::Static::GetTargets(TargetList *__return_storage_ptr__,string *file_name)

{
  bool bVar1;
  reference this;
  pointer pTVar2;
  vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  *this_00;
  __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  iterator iVar3;
  iterator iVar4;
  shared_ptr<Storage::Tape::Tape> *tape;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  *__range2;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> *target;
  iterator __end1;
  iterator __begin1;
  TargetList *__range1;
  anon_class_32_4_a56973ca append;
  Media media;
  IntType potential_platforms;
  string *local_58;
  anon_class_24_3_78b262ea try_snapshot;
  undefined1 local_38 [8];
  string extension;
  string *file_name_local;
  TargetList *targets;
  
  extension.field_2._8_8_ = file_name;
  anon_unknown.dwarf_387fdd::get_extension((string *)local_38,file_name);
  try_snapshot.targets._7_1_ = 0;
  std::
  vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  ::vector(__return_storage_ptr__);
  try_snapshot.extension = (string *)extension.field_2._8_8_;
  local_58 = (string *)local_38;
  try_snapshot.file_name = (string *)__return_storage_ptr__;
  bVar1 = GetTargets(std::__cxx11::string_const&)::$_1::operator()
                    (&local_58,"sna",Storage::State::SNA::load);
  if (bVar1) {
    try_snapshot.targets._7_1_ = 1;
  }
  else {
    bVar1 = GetTargets(std::__cxx11::string_const&)::$_1::operator()
                      (&local_58,"szx",Storage::State::SZX::load);
    if (bVar1) {
      try_snapshot.targets._7_1_ = 1;
    }
    else {
      bVar1 = GetTargets(std::__cxx11::string_const&)::$_1::operator()
                        (&local_58,"z80",Storage::State::Z80::load);
      if (bVar1) {
        try_snapshot.targets._7_1_ = 1;
      }
      else {
        media.mass_storage_devices.
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        GetMediaAndPlatforms
                  ((Media *)&append.targets,(string *)extension.field_2._8_8_,
                   (IntType *)
                   ((long)&media.mass_storage_devices.
                           super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        __range1 = (TargetList *)
                   ((long)&media.mass_storage_devices.
                           super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        append.potential_platforms = (IntType *)&append.targets;
        append.media = (Media *)extension.field_2._8_8_;
        append.file_name = (string *)__return_storage_ptr__;
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,0x760,Acorn::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,1,AmstradCPC::GetTargets)
        ;
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,2,AppleII::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,4,AppleIIgs::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,0x80,Amiga::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,8,Atari2600::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,0x10,AtariST::GetTargets)
        ;
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,0x800,Coleco::GetTargets)
        ;
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x1000,Commodore::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x2000,DiskII::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x4000,Enterprise::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x800000,FAT12::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x10000,Macintosh::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,0x20000,MSX::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,0x40000,Oric::GetTargets)
        ;
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x400000,PCCompatible::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()(&__range1,0x8000,Sega::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x180000,ZX8081::GetTargets);
        GetTargets(std::__cxx11::string_const&)::$_0::operator()
                  (&__range1,0x200000,ZXSpectrum::GetTargets);
        __end1 = std::
                 vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                 ::begin(__return_storage_ptr__);
        target = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                  *)std::
                    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                    ::end(__return_storage_ptr__);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
                                      *)&target);
          if (!bVar1) break;
          this = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
                 ::operator*(&__end1);
          pTVar2 = std::
                   unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                   ::operator->(this);
          this_00 = &(pTVar2->media).tapes;
          __end2 = std::
                   vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                   ::begin(this_00);
          tape = (shared_ptr<Storage::Tape::Tape> *)
                 std::
                 vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                 ::end(this_00);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end2,(__normal_iterator<std::shared_ptr<Storage::Tape::Tape>_*,_std::vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>_>
                                        *)&tape);
            if (!bVar1) break;
            this_01 = (__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)__gnu_cxx::
                         __normal_iterator<std::shared_ptr<Storage::Tape::Tape>_*,_std::vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>_>
                         ::operator*(&__end2);
            this_02 = std::
                      __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(this_01);
            Storage::Tape::Tape::reset(this_02);
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<Storage::Tape::Tape>_*,_std::vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>_>
            ::operator++(&__end2);
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
          ::operator++(&__end1);
        }
        iVar3 = std::
                vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                ::begin(__return_storage_ptr__);
        iVar4 = std::
                vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                ::end(__return_storage_ptr__);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>*,std::vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>,Analyser::Static::GetTargets(std::__cxx11::string_const&)::__2>
                  (iVar3._M_current,iVar4._M_current);
        try_snapshot.targets._7_1_ = 1;
        Media::~Media((Media *)&append.targets);
      }
    }
  }
  if ((try_snapshot.targets._7_1_ & 1) == 0) {
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

TargetList Analyser::Static::GetTargets(const std::string &file_name) {
	const std::string extension = get_extension(file_name);
	TargetList targets;

	// Check whether the file directly identifies a target; if so then just return that.
	const auto try_snapshot = [&](const char *ext, auto loader) -> bool {
		if(extension != ext) {
			return false;
		}
		try {
			auto target = loader(file_name);
			if(target) {
				targets.push_back(std::move(target));
				return true;
			}
		} catch(...) {}

		return false;
	};

	if(try_snapshot("sna", Storage::State::SNA::load)) return targets;
	if(try_snapshot("szx", Storage::State::SZX::load)) return targets;
	if(try_snapshot("z80", Storage::State::Z80::load)) return targets;

	// Otherwise:
	//
	// Collect all disks, tapes ROMs, etc as can be extrapolated from this file, forming the
	// union of all platforms this file might be a target for.
	TargetPlatform::IntType potential_platforms = 0;
	Media media = GetMediaAndPlatforms(file_name, potential_platforms);

	// Hand off to platform-specific determination of whether these
	// things are actually compatible and, if so, how to load them.
	const auto append = [&](TargetPlatform::IntType platform, auto evaluator) {
		if(!(potential_platforms & platform)) {
			return;
		}
		auto new_targets = evaluator(media, file_name, potential_platforms);
		std::move(new_targets.begin(), new_targets.end(), std::back_inserter(targets));
	};

	append(TargetPlatform::Acorn, Acorn::GetTargets);
	append(TargetPlatform::AmstradCPC, AmstradCPC::GetTargets);
	append(TargetPlatform::AppleII, AppleII::GetTargets);
	append(TargetPlatform::AppleIIgs, AppleIIgs::GetTargets);
	append(TargetPlatform::Amiga, Amiga::GetTargets);
	append(TargetPlatform::Atari2600, Atari2600::GetTargets);
	append(TargetPlatform::AtariST, AtariST::GetTargets);
	append(TargetPlatform::Coleco, Coleco::GetTargets);
	append(TargetPlatform::Commodore, Commodore::GetTargets);
	append(TargetPlatform::DiskII, DiskII::GetTargets);
	append(TargetPlatform::Enterprise, Enterprise::GetTargets);
	append(TargetPlatform::FAT12, FAT12::GetTargets);
	append(TargetPlatform::Macintosh, Macintosh::GetTargets);
	append(TargetPlatform::MSX, MSX::GetTargets);
	append(TargetPlatform::Oric, Oric::GetTargets);
	append(TargetPlatform::PCCompatible, PCCompatible::GetTargets);
	append(TargetPlatform::Sega, Sega::GetTargets);
	append(TargetPlatform::ZX8081, ZX8081::GetTargets);
	append(TargetPlatform::ZXSpectrum, ZXSpectrum::GetTargets);

	// Reset any tapes to their initial position.
	for(const auto &target : targets) {
		for(auto &tape : target->media.tapes) {
			tape->reset();
		}
	}

	// Sort by initial confidence. Use a stable sort in case any of the machine-specific analysers
	// picked their insertion order carefully.
	std::stable_sort(targets.begin(), targets.end(),
		[] (const std::unique_ptr<Target> &a, const std::unique_ptr<Target> &b) {
			return a->confidence > b->confidence;
		});

	return targets;
}